

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.h
# Opt level: O2

UnderwaterAcousticEmitterSystem * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::operator=
          (UnderwaterAcousticEmitterSystem *this,UnderwaterAcousticEmitterSystem *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KFLOAT32 KVar4;
  
  KVar1 = param_1->m_ui8NumBeams;
  KVar2 = param_1->m_ui16Padding1;
  this->m_ui8EmitterSystemDataLength = param_1->m_ui8EmitterSystemDataLength;
  this->m_ui8NumBeams = KVar1;
  this->m_ui16Padding1 = KVar2;
  KVar1 = (param_1->m_AES).m_ui8Function;
  KVar3 = (param_1->m_AES).m_ui8EmitterIDNumber;
  (this->m_AES).m_ui16EmitterName = (param_1->m_AES).m_ui16EmitterName;
  (this->m_AES).m_ui8Function = KVar1;
  (this->m_AES).m_ui8EmitterIDNumber = KVar3;
  KVar4 = (param_1->m_Location).m_f32Y;
  (this->m_Location).m_f32X = (param_1->m_Location).m_f32X;
  (this->m_Location).m_f32Y = KVar4;
  (this->m_Location).m_f32Z = (param_1->m_Location).m_f32Z;
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::operator=(&this->m_vUAEB,&param_1->m_vUAEB);
  return this;
}

Assistant:

class KDIS_EXPORT UnderwaterAcousticEmitterSystem : public DataTypeBase
{
protected:

    KUINT8 m_ui8EmitterSystemDataLength;

    KUINT8 m_ui8NumBeams;

    KUINT16 m_ui16Padding1;

    AcousticEmitterSystem m_AES;

    Vector m_Location;

    std::vector<UnderwaterAcousticEmitterBeam> m_vUAEB;

public:

    static const KUINT16 UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE = 20; // Min Size

    UnderwaterAcousticEmitterSystem();

    UnderwaterAcousticEmitterSystem(KDataStream &stream) noexcept(false);

    virtual ~UnderwaterAcousticEmitterSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetEmitterSystemDataLength
    // Description: Length of the emitter system in 32 bits words.
    //************************************
    KUINT8 GetEmitterSystemDataLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetNumberOfBeams
    // Description: Returns number of beams for the current system
    //************************************
    KUINT8 GetNumberOfBeams() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::SetAcousticEmitterSystem
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetAcousticEmitterSystem
    // Description: Holds infomation about a particular Underwater Acoustic emitter.
    // Parameter:   const AcousticEmitterSystem & AES
    //************************************
    void SetAcousticEmitterSystem( const AcousticEmitterSystem & AES );
    const AcousticEmitterSystem & GetAcousticEmitterSystem() const;
    AcousticEmitterSystem & GetAcousticEmitterSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::SetLocation
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetLocation
    // Description: Location of the acoustic source with respect to emitting
    //              entity coordinate system. Represented as Entity Coordinate Vector.
    // Parameter:   const Vector & L
    //************************************
    void SetLocation( const Vector & L );
    const Vector & GetLocation() const;
    Vector & GetLocation();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::AddUnderwaterAcousticEmitterBeam
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::SetUnderwaterAcousticEmitterBeam
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetUnderwaterAcousticEmitterBeam
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::ClearUnderwaterAcousticEmitterBeams
    // Description: Add a articulation parameter / Get vector or params
    //              Adding will update the Number Of Variable Params
    //              field.
    // Parameter:   const UnderwaterAcousticEmitterBeam & UAEB
    //************************************
    void AddUnderwaterAcousticEmitterBeam( const UnderwaterAcousticEmitterBeam & UAEB );
    void SetUnderwaterAcousticEmitterBeams( const std::vector<UnderwaterAcousticEmitterBeam> & UAEB );
    const std::vector<UnderwaterAcousticEmitterBeam> & GetUnderwaterAcousticEmitterBeam() const;
    void ClearUnderwaterAcousticEmitterBeams();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const UnderwaterAcousticEmitterSystem & Value ) const;
    KBOOL operator != ( const UnderwaterAcousticEmitterSystem & Value ) const;
}